

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O3

Page * __thiscall Cache<SearchBase::Page>::add(Cache<SearchBase::Page> *this,Page *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  __normal_iterator<Cache<SearchBase::Page>::Entry_*,_std::vector<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>_>
  __last;
  long lVar4;
  Entry local_70;
  
  __last = std::
           __find_if<__gnu_cxx::__normal_iterator<Cache<SearchBase::Page>::Entry*,std::vector<Cache<SearchBase::Page>::Entry,std::allocator<Cache<SearchBase::Page>::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Cache<SearchBase::Page>::freeInvalidComments()::_lambda(Cache<SearchBase::Page>::Entry_const&)_1_>>
                     ((this->entries).
                      super__Vector_base<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->entries).
                      super__Vector_base<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>::
  _M_erase(&this->entries,
           (this->entries).
           super__Vector_base<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start,(iterator)__last._M_current);
  paVar2 = &local_70.data.url.field_2;
  local_70.data.url._M_dataplus._M_p = (data->url)._M_dataplus._M_p;
  paVar1 = &(data->url).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.data.url._M_dataplus._M_p == paVar1) {
    local_70.data.url.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_70.data.url.field_2._8_8_ = *(undefined8 *)((long)&(data->url).field_2 + 8);
    local_70.data.url._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_70.data.url.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_70.data.url._M_string_length = (data->url)._M_string_length;
  paVar3 = &local_70.data.content.field_2;
  (data->url)._M_dataplus._M_p = (pointer)paVar1;
  (data->url)._M_string_length = 0;
  (data->url).field_2._M_local_buf[0] = '\0';
  local_70.data.content._M_dataplus._M_p = (data->content)._M_dataplus._M_p;
  paVar1 = &(data->content).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.data.content._M_dataplus._M_p == paVar1) {
    local_70.data.content.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_70.data.content.field_2._8_8_ = *(undefined8 *)((long)&(data->content).field_2 + 8);
    local_70.data.content._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_70.data.content.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_70.data.content._M_string_length = (data->content)._M_string_length;
  (data->content)._M_dataplus._M_p = (pointer)paVar1;
  (data->content)._M_string_length = 0;
  (data->content).field_2._M_local_buf[0] = '\0';
  lVar4 = std::chrono::_V2::system_clock::now();
  local_70.expiration.__d.__r = (duration)((this->validityTime).__r * 1000000000 + lVar4);
  std::vector<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>::
  emplace_back<Cache<SearchBase::Page>::Entry>(&this->entries,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.data.content._M_dataplus._M_p != paVar3) {
    operator_delete(local_70.data.content._M_dataplus._M_p,
                    local_70.data.content.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.data.url._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.data.url._M_dataplus._M_p,
                    local_70.data.url.field_2._M_allocated_capacity + 1);
  }
  return &(this->entries).
          super__Vector_base<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].data;
}

Assistant:

T* add(T data) {
			freeInvalidComments();
			entries.push_back( { std::move(data), Clock::now() + validityTime });
			return &entries.back().data;
		}